

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorTable.cpp
# Opt level: O0

void __thiscall ColorTable::add_entry(ColorTable *this,double a,double b,Vector *c1,Vector *c2)

{
  Vector *c2_local;
  Vector *c1_local;
  double b_local;
  double a_local;
  ColorTable *this_local;
  
  if (this->color_entries < this->max_entries + -1) {
    this->entries[this->color_entries].ta = a;
    this->entries[this->color_entries].tb = b;
    Vector::operator=(&this->entries[this->color_entries].ca,c1);
    Vector::operator=(&this->entries[this->color_entries].cb,c2);
    this->color_entries = this->color_entries + 1;
  }
  return;
}

Assistant:

void ColorTable::add_entry(double a, double b, Vector const& c1, Vector const& c2)
{
   if (color_entries < max_entries - 1)
   {
      entries[color_entries].ta = a;
      entries[color_entries].tb = b;
      entries[color_entries].ca = c1;
      entries[color_entries].cb = c2;
      color_entries++;
   }
}